

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O1

void __thiscall
AI::HierarchicalTaskNetworkComponent::senseAuditory(HierarchicalTaskNetworkComponent *this)

{
  Vector2<float> *pVVar1;
  pointer *ppSVar2;
  Vector2<float> position;
  iterator __position;
  Stimulus stimulus_00;
  float fVar3;
  World *this_00;
  GameMode *this_01;
  SoundMap *this_02;
  mapped_type *pmVar4;
  mapped_type_conflict *pmVar5;
  SoundWave *wave;
  pointer pSVar6;
  float fVar7;
  Stimulus stimulus;
  vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> sounds;
  key_type local_7c;
  Stimulus local_78;
  vector<AI::Stimulus,std::allocator<AI::Stimulus>> *local_50;
  vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> local_48;
  
  this_00 = Component::getWorld(&this->super_Component);
  this_01 = World::getAuthGameMode(this_00);
  this_02 = GameMode::getSoundMap(this_01);
  local_78.x = 7.00649e-45;
  pmVar4 = std::
           map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
           ::operator[](&(this->state).current.vectors,(key_type *)&local_78);
  position.x = pmVar4->x;
  position.y = pmVar4->y;
  SoundMap::collectSounds(&local_48,this_02,position,10);
  if (local_48.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_50 = (vector<AI::Stimulus,std::allocator<AI::Stimulus>> *)&(this->state).memory;
    pSVar6 = local_48.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (10.0 < pSVar6->intensity || pSVar6->intensity == 10.0) {
        local_78.type = Auditory;
        local_78.intensity = pSVar6->intensity;
        pVVar1 = &pSVar6->originalPosition;
        local_78.x = pVVar1->x;
        local_78.y = (pSVar6->originalPosition).y;
        fVar7 = pVVar1->x;
        fVar3 = pVVar1->y;
        local_78.field_3.auditory.tag = (Auditory)pSVar6->tag;
        __position._M_current =
             (this->state).memory.sensoryMemory.
             super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->state).memory.sensoryMemory.
            super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<AI::Stimulus,std::allocator<AI::Stimulus>>::
          _M_realloc_insert<AI::Stimulus_const&>(local_50,__position,&local_78);
        }
        else {
          *(ulong *)&(__position._M_current)->type = (ulong)(uint)local_78._36_4_ << 0x20;
          *(ulong *)&(__position._M_current)->field_3 =
               CONCAT44(local_78.field_3._4_4_,local_78.field_3.visual.tag);
          ((__position._M_current)->field_3).visual.target = local_78.field_3.visual.target;
          (__position._M_current)->x = fVar7;
          (__position._M_current)->y = fVar3;
          *(ulong *)&(__position._M_current)->intensity =
               CONCAT44(local_78._12_4_,local_78.intensity);
          ppSVar2 = &(this->state).memory.sensoryMemory.
                     super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppSVar2 = *ppSVar2 + 1;
        }
        stimulus_00._36_4_ = local_78._36_4_;
        stimulus_00.type = local_78.type;
        stimulus_00.y = local_78.y;
        stimulus_00.x = local_78.x;
        stimulus_00._12_4_ = local_78._12_4_;
        stimulus_00.intensity = local_78.intensity;
        stimulus_00.field_3._4_4_ = local_78.field_3._4_4_;
        stimulus_00.field_3.visual.tag = local_78.field_3.visual.tag;
        stimulus_00.field_3.visual.target = local_78.field_3.visual.target;
        encodeEngramIfUnique(stimulus_00,&(this->state).memory.shortTermMemory);
        local_7c = Curiosity;
        pmVar5 = std::
                 map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
                 ::operator[](&(this->state).current.values,&local_7c);
        fVar7 = Math::clamp(local_78.intensity / 10.0 + *pmVar5,0.0,100.0);
        *pmVar5 = fVar7;
      }
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != local_48.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::senseAuditory()
{
	auto& soundMap = getWorld()->getAuthGameMode()->getSoundMap();

	auto location = state.current.vectors[WorldStateIdentifier::CurrentPosition];

	auto range = 10.f;
	auto sounds = soundMap.collectSounds({location.x, location.y}, range);
	
	const float MINIMUM_INTENSITY_HACK = 10.f;

	for (auto& wave : sounds)
	{
		if (wave.intensity < MINIMUM_INTENSITY_HACK)
			continue;

		Stimulus stimulus;
		stimulus.type = StimulusType::Auditory;
		stimulus.intensity = wave.intensity;
		stimulus.x = wave.originalPosition.x;
		stimulus.y = wave.originalPosition.y;
		stimulus.auditory.tag = wave.tag;

		state.memory.sensoryMemory.push_back(stimulus);

		encodeEngramIfUnique(stimulus, state.memory.shortTermMemory);

		//auto& alertness = state.current.values[WorldStateIdentifier::Alertness];
		//alertness = FMath::Clamp(alertness + stimulus.auditory.intensity / 100.f, 0.f, 60.f);
		auto& curiosity = state.current.values[WorldStateIdentifier::Curiosity];
		curiosity = clamp(curiosity + stimulus.intensity / 10.f, 0.f, 100.f);
	}	
}